

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_chunky_entity(http_parser_t *parser)

{
  undefined1 local_40 [8];
  memptr dummy;
  size_t save_pos;
  parse_status_t status;
  scanner_t *scanner;
  http_parser_t *parser_local;
  
  if (parser->ent_position == 3) {
    dummy.length = (parser->scanner).cursor;
    parser_local._4_4_ = match(&parser->scanner,"%x%L%c",&parser->chunk_size,local_40);
    if (parser_local._4_4_ == PARSE_OK) {
      membuffer_delete(&(parser->msg).msg,dummy.length,(parser->scanner).cursor - dummy.length);
      (parser->scanner).cursor = dummy.length;
      if (parser->chunk_size == 0) {
        (parser->msg).entity.length =
             ((parser->scanner).cursor - parser->entity_start_position) +
             (parser->msg).amount_discarded;
        parser->ent_position = 6;
      }
      else {
        parser->ent_position = 5;
      }
      parser_local._4_4_ = PARSE_CONTINUE_1;
    }
    else {
      (parser->scanner).cursor = dummy.length;
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x6e8,
                 "CHUNK COULD NOT BE PARSED\n");
    }
    return parser_local._4_4_;
  }
  __assert_fail("parser->ent_position == ENTREAD_USING_CHUNKED",
                ".upnp/src/genlib/net/http/httpparser.c",0x6dd,
                "parse_status_t parser_parse_chunky_entity(http_parser_t *)");
}

Assistant:

static UPNP_INLINE parse_status_t parser_parse_chunky_entity(
	http_parser_t *parser)
{
	scanner_t *scanner = &parser->scanner;
	parse_status_t status;
	size_t save_pos;
	memptr dummy;

	assert(parser->ent_position == ENTREAD_USING_CHUNKED);

	save_pos = scanner->cursor;

	/* get size of chunk, discard extension, discard CRLF */
	status = match(scanner, "%x%L%c", &parser->chunk_size, &dummy);
	if (status != (parse_status_t)PARSE_OK) {
		scanner->cursor = save_pos;
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"CHUNK COULD NOT BE PARSED\n");
		return status;
	}
	/* remove chunk info just matched; just retain data */
	membuffer_delete(
		&parser->msg.msg, save_pos, (scanner->cursor - save_pos));
	scanner->cursor = save_pos; /* adjust scanner too */

	if (parser->chunk_size == (size_t)0) {
		/* done reading entity; determine length of entity */
		parser->msg.entity.length = parser->scanner.cursor -
					    parser->entity_start_position +
					    parser->msg.amount_discarded;

		/* read entity headers */
		parser->ent_position = ENTREAD_CHUNKY_HEADERS;
	} else {
		/* read chunk body */
		parser->ent_position = ENTREAD_CHUNKY_BODY;
	}

	return PARSE_CONTINUE_1; /* continue to reading body */
}